

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-tval.c
# Opt level: O1

wchar_t tval_sval_list(char *name,int *list,wchar_t max_size)

{
  ushort uVar1;
  wchar_t wVar2;
  object_kind *poVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  
  wVar4 = tval_find_idx(name);
  poVar3 = k_info;
  wVar5 = L'\0';
  if ((L'\xffffffff' < wVar4) && (uVar1 = z_info->k_max, wVar5 = L'\0', (ulong)uVar1 != 0)) {
    wVar5 = L'\0';
    lVar6 = 0;
    do {
      wVar2 = *(wchar_t *)(poVar3->flags + lVar6 + -0x5c);
      if (wVar2 == wVar4 && wVar2 != L'\0') {
        bVar8 = true;
        if (wVar5 < max_size) {
          lVar7 = (long)wVar5;
          wVar5 = wVar5 + L'\x01';
          list[lVar7] = *(int *)(poVar3->flags + lVar6 + -0x58);
          goto LAB_0019b8eb;
        }
      }
      else {
LAB_0019b8eb:
        bVar8 = false;
      }
    } while ((!bVar8) &&
            (bVar8 = (ulong)uVar1 * 0x2a0 + -0x2a0 != lVar6, lVar6 = lVar6 + 0x2a0, bVar8));
  }
  return wVar5;
}

Assistant:

int tval_sval_list(const char *name, int *list, int max_size)
{
	size_t i;
	int num = 0;
	int tval = tval_find_idx(name);

	if (tval < 0) return 0;

	for (i = 0; i < z_info->k_max; i++) {
		struct object_kind *kind = &k_info[i];

		if (!kind->tval) continue;
		if (kind->tval != tval) continue;
		if (num >= max_size) break;
		list[num++] = kind->sval;
	}

	return num;
}